

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<float,double>
                 (size_t nrows,int *x,int ncat,double *buffer_prob,MissingAction missing_action,
                 CategSplit cat_split_type,Xoshiro256PP *rnd_generator,float *w)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  reference pvVar2;
  int in_EDX;
  long in_RSI;
  ulong in_RDI;
  double dVar3;
  double *unaff_retaddr;
  int in_stack_0000000c;
  int *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  Xoshiro256PP *in_stack_00000030;
  size_t row;
  double w_this;
  vector<double,_std::allocator<double>_> buffer_cnt;
  allocator_type *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  ulong local_70;
  vector<double,_std::allocator<double>_> local_40;
  int local_14;
  long local_10;
  
  pvVar1 = (vector<double,_std::allocator<double>_> *)(long)(in_EDX + 1);
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<double>::allocator((allocator<double> *)0x45446e);
  std::vector<double,_std::allocator<double>_>::vector
            (pvVar1,in_stack_ffffffffffffff78,(value_type_conflict *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  std::allocator<double>::~allocator((allocator<double> *)0x454493);
  for (local_70 = 0; local_70 < in_RDI; local_70 = local_70 + 1) {
    pvVar1 = (vector<double,_std::allocator<double>_> *)(double)(float)in_stack_00000010[local_70];
    if (*(int *)(local_10 + local_70 * 4) < 0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_14);
      *pvVar2 = (double)pvVar1 + *pvVar2;
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_40,(long)*(int *)(local_10 + local_70 * 4));
      *pvVar2 = (double)pvVar1 + *pvVar2;
      pvVar1 = in_stack_ffffffffffffff70;
    }
    in_stack_ffffffffffffff70 = pvVar1;
  }
  dVar3 = calc_kurtosis_weighted_internal<float*restrict,double>
                    (in_stack_00000018,in_stack_00000010,in_stack_0000000c,unaff_retaddr,
                     (MissingAction)(in_RDI >> 0x20),(CategSplit)in_RDI,in_stack_00000030,
                     (float **)row);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff70);
  return dVar3;
}

Assistant:

double calc_kurtosis_weighted(size_t nrows, int x[], int ncat, double *restrict buffer_prob,
                              MissingAction missing_action, CategSplit cat_split_type,
                              RNG_engine &rnd_generator, real_t *restrict w)
{
    std::vector<ldouble_safe> buffer_cnt(ncat+1, 0.);
    ldouble_safe w_this;

    for (size_t row = 0; row < nrows; row++)
    {
        w_this = w[row];
        if (likely(x[row] >= 0))
            buffer_cnt[x[row]] += w_this;
        else
            buffer_cnt[ncat] += w_this;
    }
    
    return calc_kurtosis_weighted_internal<real_t *restrict, ldouble_safe>(
                                           buffer_cnt, x, ncat,
                                           buffer_prob, missing_action, cat_split_type,
                                           rnd_generator, w);
}